

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

bool __thiscall RenX_CommandsPlugin::initialize(RenX_CommandsPlugin *this)

{
  undefined1 *this_00;
  const_pointer pvVar1;
  const_pointer pvVar2;
  size_type sVar3;
  duration<long,_std::ratio<1L,_1L>_> *pdVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  basic_string_view<char,_std::char_traits<char>_> *args_5;
  basic_string_view<char,_std::char_traits<char>_> *args;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  undefined1 auVar6 [16];
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd50;
  size_t local_1f0;
  char *local_1e8;
  size_t local_1e0;
  char *local_1d8;
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string_view local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_90;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined1 local_50 [8];
  string_view max_tban_time;
  char *local_38;
  size_t local_30;
  char *local_28;
  undefined1 local_20 [8];
  string_view default_tban_time;
  RenX_CommandsPlugin *this_local;
  
  this_00 = &this->field_0x38;
  default_tban_time._M_str = (char *)this;
  bVar5 = sv("DefaultTBanTime",0xf);
  join_0x00000010_0x00000000_ = sv("1d",2);
  local_30 = bVar5._M_len;
  local_28 = bVar5._M_str;
  auVar6 = Jupiter::Config::get(this_00,local_30,local_28,max_tban_time._M_str,local_38);
  default_tban_time._M_len = auVar6._8_8_;
  local_20 = auVar6._0_8_;
  local_60 = sv("MaxTBanTime",0xb);
  local_70 = sv("1w",2);
  auVar6 = Jupiter::Config::get
                     (this_00,local_60._M_len,local_60._M_str,local_70._M_len,local_70._M_str);
  max_tban_time._M_len = auVar6._8_8_;
  local_50 = auVar6._0_8_;
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  local_80 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                       (pvVar1,pvVar2 + sVar3);
  (this->m_defaultTempBanTime).__r = local_80.duration.__r;
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_50);
  local_90 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                       (pvVar1,pvVar2 + sVar3);
  pdVar4 = std::max<std::chrono::duration<long,std::ratio<1l,1l>>>
                     (&local_90.duration,&this->m_defaultTempBanTime);
  (this->m_maxTempBanTime).__r = pdVar4->__r;
  local_b0 = sv("PlayerInfoFormat",0x10);
  local_c0 = sv("\x0303[Player Info]\x03{TCOLOR} \x02{RNAME}\x02 - ID: {ID} - Team: \x02{TEAML}\x02 - Vehicle Kills: {VEHICLEKILLS} - Building Kills {BUILDINGKILLS} - Kills {KILLS} - Deaths: {DEATHS} - KDR: {KDR} - Access: {ACCESS}"
                ,0xc4);
  local_a0 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (this_00,local_b0._M_len,local_b0._M_str,local_c0._M_len,local_c0._M_str);
  std::__cxx11::string::operator=((string *)&this->m_playerInfoFormat,&local_a0);
  local_f0 = sv("AdminPlayerInfoFormat",0x15);
  std::operator+(&local_110,&this->m_playerInfoFormat,
                 " - IP: \x02{IP}\x02 - HWID: \x02{HWID}\x02 - RDNS: \x02{RDNS}\x02 - Steam ID: \x02{STEAM}"
                );
  Jupiter::Config::get<std::__cxx11::string>(&local_e0,(Config *)this_00,local_f0,&local_110);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_adminPlayerInfoFormat,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_110);
  local_150 = sv("BuildingInfoFormat",0x12);
  local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )sv("\x03",1);
  args = (basic_string_view<char,_std::char_traits<char>_> *)(RenX::tags + 0x2568);
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (RenX::tags + 0x2408);
  local_190 = sv("\x03",1);
  local_1a0 = sv(" - ",3);
  local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               )sv("\x0307",3);
  args_5 = (basic_string_view<char,_std::char_traits<char>_> *)(RenX::tags + 0x2488);
  local_1c0 = sv("%",1);
  jessilib::
  join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>>
            (&local_170,(jessilib *)local_180._M_local_buf,args,args_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190,
             &local_1a0,(basic_string_view<char,_std::char_traits<char>_> *)&local_1b0,args_5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c0,
             in_stack_fffffffffffffd50);
  Jupiter::Config::get<std::__cxx11::string>
            (&local_140,(Config *)&this->field_0x38,local_150,&local_170);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_buildingInfoFormat,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_170);
  bVar5 = sv("StaffTitle",10);
  bVar7 = sv("Moderator",9);
  local_1e0 = bVar5._M_len;
  local_1d8 = bVar5._M_str;
  local_1f0 = bVar7._M_len;
  local_1e8 = bVar7._M_str;
  local_1d0 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get(&this->field_0x38,local_1e0,local_1d8,local_1f0,local_1e8);
  std::__cxx11::string::operator=((string *)&this->m_staffTitle,&local_1d0);
  RenX::sanitizeTags((string *)&this->m_playerInfoFormat);
  RenX::sanitizeTags((string *)&this->m_adminPlayerInfoFormat);
  RenX::sanitizeTags((string *)&this->m_buildingInfoFormat);
  return true;
}

Assistant:

bool RenX_CommandsPlugin::initialize() {
	auto default_tban_time = this->config.get("DefaultTBanTime"sv, "1d"sv);
	auto max_tban_time = this->config.get("MaxTBanTime"sv, "1w"sv);
	m_defaultTempBanTime = jessilib::duration_from_string(default_tban_time.data(), default_tban_time.data() + default_tban_time.size()).duration;
	m_maxTempBanTime = std::max(jessilib::duration_from_string(max_tban_time.data(), max_tban_time.data() + max_tban_time.size()).duration, m_defaultTempBanTime);
	m_playerInfoFormat = this->config.get("PlayerInfoFormat"sv, IRCCOLOR "03[Player Info]" IRCCOLOR "{TCOLOR} " IRCBOLD "{RNAME}" IRCBOLD " - ID: {ID} - Team: " IRCBOLD "{TEAML}" IRCBOLD " - Vehicle Kills: {VEHICLEKILLS} - Building Kills {BUILDINGKILLS} - Kills {KILLS} - Deaths: {DEATHS} - KDR: {KDR} - Access: {ACCESS}"sv);
	m_adminPlayerInfoFormat = this->config.get("AdminPlayerInfoFormat"sv, m_playerInfoFormat + " - IP: " IRCBOLD "{IP}" IRCBOLD " - HWID: " IRCBOLD "{HWID}" IRCBOLD " - RDNS: " IRCBOLD "{RDNS}" IRCBOLD " - Steam ID: " IRCBOLD "{STEAM}");
	m_buildingInfoFormat = this->config.get("BuildingInfoFormat"sv, jessilib::join<std::string>(""sv IRCCOLOR, RenX::tags->buildingTeamColorTag, RenX::tags->buildingNameTag, ""sv IRCCOLOR, " - "sv, IRCCOLOR "07"sv, RenX::tags->buildingHealthPercentageTag, "%"sv));
	m_staffTitle = this->config.get("StaffTitle"sv, "Moderator"sv);

	RenX::sanitizeTags(m_playerInfoFormat);
	RenX::sanitizeTags(m_adminPlayerInfoFormat);
	RenX::sanitizeTags(m_buildingInfoFormat);
	return true;
}